

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::date_t,unsigned_int>
          (BaseAppender *this,Vector *col,date_t input)

{
  NotImplementedException *this_00;
  undefined4 in_register_00000014;
  size_type __dnew;
  size_type local_48;
  string local_40;
  
  this_00 = (NotImplementedException *)
            __cxa_allocate_exception(0x10,col,CONCAT44(in_register_00000014,input.days));
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_48 = 0x26;
  local_40._M_dataplus._M_p =
       (pointer)::std::__cxx11::string::_M_create((ulong *)&local_40,(ulong)&local_48);
  local_40.field_2._M_allocated_capacity = local_48;
  builtin_strncpy(local_40._M_dataplus._M_p,"Unimplemented type for cast (%s -> %s)",0x26);
  local_40._M_string_length = local_48;
  local_40._M_dataplus._M_p[local_48] = '\0';
  NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
            (this_00,&local_40,INT32,UINT32);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BaseAppender::~BaseAppender() {
}